

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall
Memory::Recycler::VerifyLargeAllocZeroFill
          (Recycler *this,void *address,size_t size,ObjectInfoBits attributes)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  
  if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
    if (*address != &PTR_Finalize_00357058) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1e82,"((*(void**)(&dummy)) == *((void**)address))",
                         "(*(void**)(&dummy)) == *((void**)address)");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    address = (void *)((long)address + 8);
    size = size - 8;
  }
  VerifyZeroFill(this,address,size);
  return;
}

Assistant:

void
Recycler::VerifyLargeAllocZeroFill(void * address, size_t size, ObjectInfoBits attributes)
{
    // Large allocs will have already written the dummy vtable at the beginning of the allocation
    // if either FinalizeBit or TrackBit attributes were set. Skip the verify for that memory
    // if that is the case.
    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Verify that it really is the dummy v-table before skipping it.
        DummyVTableObject dummy;
        Assert((*(void**)(&dummy)) == *((void**)address));

        address = ((char*)address) + sizeof(DummyVTableObject);
        size -= sizeof(DummyVTableObject);
    }
    VerifyZeroFill(address, size);
}